

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O0

void __thiscall
Assimp::SGSpatialSort::Add(SGSpatialSort *this,aiVector3D *vPosition,uint index,uint smoothingGroup)

{
  Entry local_3c;
  float local_24;
  uint32_t local_20;
  float distance;
  uint smoothingGroup_local;
  uint index_local;
  aiVector3D *vPosition_local;
  SGSpatialSort *this_local;
  
  local_20 = smoothingGroup;
  distance = (float)index;
  _smoothingGroup_local = vPosition;
  vPosition_local = &this->mPlaneNormal;
  local_24 = ::operator*(vPosition,&this->mPlaneNormal);
  Entry::Entry(&local_3c,(uint)distance,_smoothingGroup_local,local_24,local_20);
  std::vector<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>::
  push_back(&this->mPositions,&local_3c);
  return;
}

Assistant:

void SGSpatialSort::Add(const aiVector3D& vPosition, unsigned int index,
    unsigned int smoothingGroup)
{
    // store position by index and distance
    float distance = vPosition * mPlaneNormal;
    mPositions.push_back( Entry( index, vPosition,
        distance, smoothingGroup));
}